

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::
SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRCombinedImageSampler,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>,_8UL>
::clear(SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRCombinedImageSampler,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>,_8UL>
        *this)

{
  ulong local_18;
  size_t i;
  SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRCombinedImageSampler,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>,_8UL>
  *this_local;
  
  for (local_18 = 0;
      local_18 <
      (this->
      super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRCombinedImageSampler,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
      ).buffer_size; local_18 = local_18 + 1) {
    ::std::
    unique_ptr<diligent_spirv_cross::SPIRCombinedImageSampler,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>
    ::~unique_ptr((this->
                  super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRCombinedImageSampler,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
                  ).ptr + local_18);
  }
  (this->
  super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRCombinedImageSampler,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
  ).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}